

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# millerrabin.c
# Opt level: O1

uint miller_rabin_checks_needed(uint bits)

{
  uint uVar1;
  
  uVar1 = 2;
  if ((((((bits < 0x514) && (uVar1 = 3, bits < 0x352)) && (uVar1 = 4, bits < 0x28a)) &&
       ((uVar1 = 5, bits < 0x226 && (uVar1 = 6, bits < 0x1c2)))) &&
      ((uVar1 = 7, bits < 400 && ((uVar1 = 8, bits < 0x15e && (uVar1 = 9, bits < 300)))))) &&
     ((uVar1 = 0xc, bits < 0xfa && (uVar1 = 0xf, bits < 200)))) {
    uVar1 = (uint)(bits < 0x96) * 9 + 0x12;
  }
  return uVar1;
}

Assistant:

unsigned miller_rabin_checks_needed(unsigned bits)
{
    /* Table 4.4 from Handbook of Applied Cryptography */
    return (bits >= 1300 ?  2 : bits >= 850 ?  3 : bits >= 650 ?  4 :
            bits >=  550 ?  5 : bits >= 450 ?  6 : bits >= 400 ?  7 :
            bits >=  350 ?  8 : bits >= 300 ?  9 : bits >= 250 ? 12 :
            bits >=  200 ? 15 : bits >= 150 ? 18 : 27);
}